

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralString.cpp
# Opt level: O2

LiteralString * Js::LiteralString::CreateEmptyString(StaticType *type)

{
  ScriptContext *pSVar1;
  Recycler *alloc;
  LiteralString *this;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  pSVar1 = Js::Type::GetScriptContext(&type->super_Type);
  local_40 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_85b7404;
  data.filename._0_4_ = 0x29;
  alloc = Memory::Recycler::TrackAllocInfo(pSVar1->recycler,(TrackAllocData *)local_40);
  this = (LiteralString *)new<Memory::Recycler>(0x20,alloc,0x37a1d4);
  LiteralString(this,type,L"",0);
  return this;
}

Assistant:

LiteralString* LiteralString::CreateEmptyString(StaticType* type)
    {
        return RecyclerNew(type->GetScriptContext()->GetRecycler(), LiteralString, type, _u(""), 0);
    }